

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool __thiscall gflags::anon_unknown_2::FlagValue::ParseFrom(FlagValue *this,char *value)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  longlong lVar4;
  ulonglong uVar5;
  size_t sVar6;
  double dVar7;
  double r_4;
  uint64 r_3;
  int64 r_2;
  uint64 r_1;
  int64 r;
  char *pcStack_88;
  int base;
  char *end;
  size_t i;
  char *kFalse [5];
  char *local_48;
  char *kTrue [5];
  char *value_local;
  FlagValue *this_local;
  
  kTrue[4] = value;
  if (this->type_ == '\0') {
    memcpy(&local_48,&DAT_00139d40,0x28);
    memcpy(&i,&DAT_00139d70,0x28);
    for (end = (char *)0x0; end < (char *)0x5; end = end + 1) {
      iVar2 = strcasecmp(kTrue[4],kTrue[(long)(end + -1)]);
      if (iVar2 == 0) {
        *(undefined1 *)this->value_buffer_ = 1;
        return true;
      }
      iVar2 = strcasecmp(kTrue[4],kFalse[(long)(end + -1)]);
      if (iVar2 == 0) {
        *(undefined1 *)this->value_buffer_ = 0;
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  else if (this->type_ == '\x06') {
    std::__cxx11::string::operator=((string *)this->value_buffer_,value);
    this_local._7_1_ = true;
  }
  else if (*value == '\0') {
    this_local._7_1_ = false;
  }
  else {
    r._4_4_ = 10;
    if ((*value == '0') && ((value[1] == 'x' || (value[1] == 'X')))) {
      r._4_4_ = 0x10;
    }
    piVar3 = __errno_location();
    *piVar3 = 0;
    switch(this->type_) {
    case '\x01':
      lVar4 = strtoll(kTrue[4],&stack0xffffffffffffff78,r._4_4_);
      piVar3 = __errno_location();
      pcVar1 = kTrue[4];
      if ((*piVar3 == 0) && (sVar6 = strlen(kTrue[4]), pcStack_88 == pcVar1 + sVar6)) {
        if ((int)lVar4 == lVar4) {
          *(int *)this->value_buffer_ = (int)lVar4;
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
      break;
    case '\x02':
      for (; *kTrue[4] == ' '; kTrue[4] = kTrue[4] + 1) {
      }
      if (*kTrue[4] == '-') {
        this_local._7_1_ = false;
      }
      else {
        uVar5 = strtoull(kTrue[4],&stack0xffffffffffffff78,r._4_4_);
        piVar3 = __errno_location();
        pcVar1 = kTrue[4];
        if ((*piVar3 == 0) && (sVar6 = strlen(kTrue[4]), pcStack_88 == pcVar1 + sVar6)) {
          if ((uVar5 & 0xffffffff) == uVar5) {
            *(int *)this->value_buffer_ = (int)uVar5;
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      break;
    case '\x03':
      lVar4 = strtoll(kTrue[4],&stack0xffffffffffffff78,r._4_4_);
      piVar3 = __errno_location();
      pcVar1 = kTrue[4];
      if ((*piVar3 == 0) && (sVar6 = strlen(kTrue[4]), pcStack_88 == pcVar1 + sVar6)) {
        *(longlong *)this->value_buffer_ = lVar4;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      break;
    case '\x04':
      for (; *kTrue[4] == ' '; kTrue[4] = kTrue[4] + 1) {
      }
      if (*kTrue[4] == '-') {
        this_local._7_1_ = false;
      }
      else {
        uVar5 = strtoull(kTrue[4],&stack0xffffffffffffff78,r._4_4_);
        piVar3 = __errno_location();
        pcVar1 = kTrue[4];
        if ((*piVar3 == 0) && (sVar6 = strlen(kTrue[4]), pcStack_88 == pcVar1 + sVar6)) {
          *(ulonglong *)this->value_buffer_ = uVar5;
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      break;
    case '\x05':
      dVar7 = strtod(kTrue[4],&stack0xffffffffffffff78);
      piVar3 = __errno_location();
      pcVar1 = kTrue[4];
      if ((*piVar3 == 0) && (sVar6 = strlen(kTrue[4]), pcStack_88 == pcVar1 + sVar6)) {
        *(double *)this->value_buffer_ = dVar7;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                    ,0x16c,"bool gflags::(anonymous namespace)::FlagValue::ParseFrom(const char *)")
      ;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FlagValue::ParseFrom(const char* value) {
  if (type_ == FV_BOOL) {
    const char* kTrue[] = { "1", "t", "true", "y", "yes" };
    const char* kFalse[] = { "0", "f", "false", "n", "no" };
    COMPILE_ASSERT(sizeof(kTrue) == sizeof(kFalse), true_false_equal);
    for (size_t i = 0; i < sizeof(kTrue)/sizeof(*kTrue); ++i) {
      if (strcasecmp(value, kTrue[i]) == 0) {
        SET_VALUE_AS(bool, true);
        return true;
      } else if (strcasecmp(value, kFalse[i]) == 0) {
        SET_VALUE_AS(bool, false);
        return true;
      }
    }
    return false;   // didn't match a legal input

  } else if (type_ == FV_STRING) {
    SET_VALUE_AS(string, value);
    return true;
  }

  // OK, it's likely to be numeric, and we'll be using a strtoXXX method.
  if (value[0] == '\0')   // empty-string is only allowed for string type.
    return false;
  char* end;
  // Leading 0x puts us in base 16.  But leading 0 does not put us in base 8!
  // It caused too many bugs when we had that behavior.
  int base = 10;    // by default
  if (value[0] == '0' && (value[1] == 'x' || value[1] == 'X'))
    base = 16;
  errno = 0;

  switch (type_) {
    case FV_INT32: {
      const int64 r = strto64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      if (static_cast<int32>(r) != r)  // worked, but number out of range
        return false;
      SET_VALUE_AS(int32, static_cast<int32>(r));
      return true;
    }
    case FV_UINT32: {
      while (*value == ' ') value++;
      if (*value == '-') return false;  // negative number
      const uint64 r = strtou64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
        if (static_cast<uint32>(r) != r)  // worked, but number out of range
        return false;
      SET_VALUE_AS(uint32, static_cast<uint32>(r));
      return true;
    }
    case FV_INT64: {
      const int64 r = strto64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      SET_VALUE_AS(int64, r);
      return true;
    }
    case FV_UINT64: {
      while (*value == ' ') value++;
      if (*value == '-') return false;  // negative number
      const uint64 r = strtou64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      SET_VALUE_AS(uint64, r);
      return true;
    }
    case FV_DOUBLE: {
      const double r = strtod(value, &end);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      SET_VALUE_AS(double, r);
      return true;
    }
    default: {
      assert(false);  // unknown type
      return false;
    }
  }
}